

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_delay_2.h
# Opt level: O0

void __thiscall PlayerDelay_2::~PlayerDelay_2(PlayerDelay_2 *this)

{
  void *in_RDI;
  
  ~PlayerDelay_2((PlayerDelay_2 *)0x10b868);
  operator_delete(in_RDI);
  return;
}

Assistant:

PlayerDelay_2 (const std::string& name) :
        Player(name)
        {}